

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::fixBlockUniformOffsets
          (TParseContext *this,TQualifier *qualifier,TTypeList *typeList)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *puVar7;
  int *piVar8;
  undefined4 extraout_var_01;
  bool local_71;
  int local_4c;
  int local_48;
  int memberAlignment;
  int dummyStride;
  TLayoutMatrix subMatrixLayout;
  TSourceLoc *memberLoc;
  TQualifier *memberQualifier;
  int local_28;
  uint member;
  int memberSize;
  int offset;
  TTypeList *typeList_local;
  TQualifier *qualifier_local;
  TParseContext *this_local;
  
  _memberSize = &typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  typeList_local = (TTypeList *)qualifier;
  qualifier_local = (TQualifier *)this;
  bVar2 = storageCanHaveLayoutInBlock
                    ((TStorageQualifier)*(undefined8 *)&qualifier->field_0x8 & 0x7f);
  if (((bVar2) || (bVar2 = TQualifier::isTaskMemory((TQualifier *)typeList_local), bVar2)) &&
     ((((ulong)(typeList_local->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_finish & 0xf) == 2 ||
      ((((ulong)(typeList_local->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_finish & 0xf) == 3 ||
       (((ulong)(typeList_local->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_finish & 0xf) == 5)))))) {
    member = 0;
    for (memberQualifier._4_4_ = 0; uVar4 = (ulong)memberQualifier._4_4_,
        sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (_memberSize), uVar4 < sVar5;
        memberQualifier._4_4_ = memberQualifier._4_4_ + 1) {
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_memberSize,(ulong)memberQualifier._4_4_);
      iVar3 = (*pvVar6->type->_vptr_TType[10])();
      memberLoc = (TSourceLoc *)CONCAT44(extraout_var,iVar3);
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_memberSize,(ulong)memberQualifier._4_4_);
      _dummyStride = &pvVar6->loc;
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_memberSize,(ulong)memberQualifier._4_4_);
      iVar3 = (*pvVar6->type->_vptr_TType[10])();
      memberAlignment = (int)((ulong)*(undefined8 *)(CONCAT44(extraout_var_00,iVar3) + 8) >> 0x3d);
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_memberSize,(ulong)memberQualifier._4_4_);
      uVar1 = memberAlignment;
      if (memberAlignment == 0) {
        uVar1 = (uint)((ulong)(typeList_local->
                              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ).
                              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 0x3d);
      }
      local_71 = uVar1 == 1;
      local_4c = TIntermediate::getMemberAlignment
                           (pvVar6->type,&local_28,&local_48,
                            (uint)(*(byte *)&(typeList_local->
                                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ).
                                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ._M_impl.super__Vector_impl_data._M_finish & 0xf),
                            local_71);
      bVar2 = TQualifier::hasOffset((TQualifier *)memberLoc);
      if (bVar2) {
        bVar2 = IsMultipleOfPow2<int>(*(int *)&memberLoc->field_0x14,local_4c);
        if (!bVar2) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,_dummyStride,"must be a multiple of the member\'s alignment","offset",
                     "(layout offset = %d | member alignment = %d)",
                     (ulong)*(uint *)&memberLoc->field_0x14,local_4c);
        }
        if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
          if (*(int *)&memberLoc->field_0x14 < (int)member) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,_dummyStride,"cannot lie in previous members","offset","");
          }
          puVar7 = (uint *)std::max<int>((int *)&member,(int *)&memberLoc->field_0x14);
          member = *puVar7;
        }
        else {
          member = *(uint *)&memberLoc->field_0x14;
        }
      }
      bVar2 = TQualifier::hasAlign((TQualifier *)memberLoc);
      if (bVar2) {
        piVar8 = std::max<int>(&local_4c,(int *)(memberLoc + 1));
        local_4c = *piVar8;
      }
      RoundToPow2<int>((int *)&member,local_4c);
      uVar1 = member;
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_memberSize,(ulong)memberQualifier._4_4_);
      iVar3 = (*pvVar6->type->_vptr_TType[10])();
      *(uint *)(CONCAT44(extraout_var_01,iVar3) + 0x14) = uVar1;
      member = local_28 + member;
    }
  }
  return;
}

Assistant:

void TParseContext::fixBlockUniformOffsets(TQualifier& qualifier, TTypeList& typeList)
{
    if (!storageCanHaveLayoutInBlock(qualifier.storage) && !qualifier.isTaskMemory())
        return;
    if (qualifier.layoutPacking != ElpStd140 && qualifier.layoutPacking != ElpStd430 && qualifier.layoutPacking != ElpScalar)
        return;

    int offset = 0;
    int memberSize;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;

        // "When align is applied to an array, it effects only the start of the array, not the array's internal stride."

        // modify just the children's view of matrix layout, if there is one for this member
        TLayoutMatrix subMatrixLayout = typeList[member].type->getQualifier().layoutMatrix;
        int dummyStride;
        int memberAlignment = intermediate.getMemberAlignment(*typeList[member].type, memberSize, dummyStride, qualifier.layoutPacking,
                                                              subMatrixLayout != ElmNone ? subMatrixLayout == ElmRowMajor : qualifier.layoutMatrix == ElmRowMajor);
        if (memberQualifier.hasOffset()) {
            // "The specified offset must be a multiple
            // of the base alignment of the type of the block member it qualifies, or a compile-time error results."
            if (! IsMultipleOfPow2(memberQualifier.layoutOffset, memberAlignment))
                error(memberLoc, "must be a multiple of the member's alignment", "offset",
                    "(layout offset = %d | member alignment = %d)", memberQualifier.layoutOffset, memberAlignment);

            // GLSL: "It is a compile-time error to specify an offset that is smaller than the offset of the previous
            // member in the block or that lies within the previous member of the block"
            if (spvVersion.spv == 0) {
                if (memberQualifier.layoutOffset < offset)
                    error(memberLoc, "cannot lie in previous members", "offset", "");

                // "The offset qualifier forces the qualified member to start at or after the specified
                // integral-constant expression, which will be its byte offset from the beginning of the buffer.
                // "The actual offset of a member is computed as
                // follows: If offset was declared, start with that offset, otherwise start with the next available offset."
                offset = std::max(offset, memberQualifier.layoutOffset);
            } else {
                // TODO: Vulkan: "It is a compile-time error to have any offset, explicit or assigned,
                // that lies within another member of the block."

                offset = memberQualifier.layoutOffset;
            }
        }

        // "The actual alignment of a member will be the greater of the specified align alignment and the standard
        // (e.g., std140) base alignment for the member's type."
        if (memberQualifier.hasAlign())
            memberAlignment = std::max(memberAlignment, memberQualifier.layoutAlign);

        // "If the resulting offset is not a multiple of the actual alignment,
        // increase it to the first offset that is a multiple of
        // the actual alignment."
        RoundToPow2(offset, memberAlignment);
        typeList[member].type->getQualifier().layoutOffset = offset;
        offset += memberSize;
    }
}